

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spaceusage.c
# Opt level: O0

sizes fuse8(size_t n)

{
  sizes sVar1;
  _Bool _Var2;
  void *__ptr;
  ulong in_RDI;
  _Bool is_ok;
  size_t i;
  uint64_t *big_set;
  binary_fuse8_t filter;
  sizes s;
  binary_fuse8_t *in_stack_00000098;
  uint32_t in_stack_000000a4;
  uint64_t *in_stack_000000a8;
  ulong local_50;
  undefined1 local_40 [24];
  binary_fuse8_t *in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffe4;
  size_t local_10;
  size_t local_8;
  
  memset(local_40,0,0x28);
  _Var2 = binary_fuse8_allocate(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8);
  if (_Var2) {
    __ptr = malloc(in_RDI << 3);
    for (local_50 = 0; local_50 < in_RDI; local_50 = local_50 + 1) {
      *(ulong *)((long)__ptr + local_50 * 8) = local_50;
    }
    _Var2 = binary_fuse8_populate(in_stack_000000a8,in_stack_000000a4,in_stack_00000098);
    if (!_Var2) {
      printf("populating failed\n");
    }
    free(__ptr);
    local_10 = binary_fuse8_serialization_bytes((binary_fuse8_t *)local_40);
    local_8 = binary_fuse8_pack_bytes((binary_fuse8_t *)local_40);
    binary_fuse8_free((binary_fuse8_t *)0x102442);
  }
  else {
    printf("allocation failed\n");
    local_10 = 0;
    local_8 = 0;
  }
  sVar1.pack = local_8;
  sVar1.standard = local_10;
  return sVar1;
}

Assistant:

sizes fuse8(size_t n) {
  binary_fuse8_t filter = {0};
  if (! binary_fuse8_allocate(n, &filter)) {
    printf("allocation failed\n");
    return (sizes) {0, 0};
  }
  uint64_t* big_set = malloc(n * sizeof(uint64_t));
  for(size_t i = 0; i < n; i++) {
    big_set[i] = i;
  }
  bool is_ok = binary_fuse8_populate(big_set, n, &filter);
  if(! is_ok ) {
    printf("populating failed\n");
  }
  free(big_set);
  sizes s = {
    .standard = binary_fuse8_serialization_bytes(&filter),
    .pack = binary_fuse8_pack_bytes(&filter)
  };
  binary_fuse8_free(&filter);
  return s;
}